

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteErrorFromPosixError(int posixError,int unqliteIOErr)

{
  ulong uVar1;
  
  if (posixError < 4) {
    if (posixError == 0) {
      return 0;
    }
    if (posixError == 1) {
      return -0x13;
    }
  }
  else {
    if ((uint)posixError < 0x26) {
      uVar1 = (ulong)(uint)posixError;
      if ((0x2000010810U >> (uVar1 & 0x3f) & 1) != 0) {
        return -0xe;
      }
      if (uVar1 == 0xd) {
        return -0xe;
      }
      if (uVar1 == 0x23) {
        return -2;
      }
    }
    if (posixError == 0x6e) {
      return -0xe;
    }
  }
  return -0x4c;
}

Assistant:

static int unqliteErrorFromPosixError(int posixError, int unqliteIOErr) {
  switch (posixError) {
  case 0: 
    return UNQLITE_OK;
    
  case EAGAIN:
  case ETIMEDOUT:
  case EBUSY:
  case EINTR:
  case ENOLCK:  
    /* random NFS retry error, unless during file system support 
     * introspection, in which it actually means what it says */
    return UNQLITE_BUSY;
 
  case EACCES: 
    /* EACCES is like EAGAIN during locking operations, but not any other time*/
      return UNQLITE_BUSY;
    
  case EPERM: 
    return UNQLITE_PERM;
    
  case EDEADLK:
    return UNQLITE_IOERR;
    
#if EOPNOTSUPP!=ENOTSUP
  case EOPNOTSUPP: 
    /* something went terribly awry, unless during file system support 
     * introspection, in which it actually means what it says */
#endif
#ifdef ENOTSUP
  case ENOTSUP: 
    /* invalid fd, unless during file system support introspection, in which 
     * it actually means what it says */
#endif
  case EIO:
  case EBADF:
  case EINVAL:
  case ENOTCONN:
  case ENODEV:
  case ENXIO:
  case ENOENT:
  case ESTALE:
  case ENOSYS:
    /* these should force the client to close the file and reconnect */
    
  default: 
    return unqliteIOErr;
  }
}